

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

Msat_Clause_t * Msat_SolverRecord(Msat_Solver_t *p,Msat_IntVec_t *vLits)

{
  Msat_IntVec_t *p_00;
  int iVar1;
  Msat_Clause_t *pMStack_20;
  int Value;
  Msat_Clause_t *pC;
  Msat_IntVec_t *vLits_local;
  Msat_Solver_t *p_local;
  
  pC = (Msat_Clause_t *)vLits;
  vLits_local = (Msat_IntVec_t *)p;
  iVar1 = Msat_IntVecReadSize(vLits);
  if (iVar1 == 0) {
    __assert_fail("Msat_IntVecReadSize(vLits) != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                  ,0x96,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
  }
  iVar1 = Msat_ClauseCreate((Msat_Solver_t *)vLits_local,(Msat_IntVec_t *)pC,1,
                            &stack0xffffffffffffffe0);
  p_00 = vLits_local;
  if (iVar1 != 0) {
    iVar1 = Msat_IntVecReadEntry((Msat_IntVec_t *)pC,0);
    iVar1 = Msat_SolverEnqueue((Msat_Solver_t *)p_00,iVar1,pMStack_20);
    if (iVar1 != 0) {
      if (pMStack_20 != (Msat_Clause_t *)0x0) {
        Msat_ClauseVecPush((Msat_ClauseVec_t *)vLits_local[1].pArray,pMStack_20);
      }
      return pMStack_20;
    }
    __assert_fail("Value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                  ,0x9a,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
  }
  __assert_fail("Value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                ,0x98,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
}

Assistant:

Msat_Clause_t * Msat_SolverRecord( Msat_Solver_t * p, Msat_IntVec_t * vLits )
{
    Msat_Clause_t * pC;
    int Value;
    assert( Msat_IntVecReadSize(vLits) != 0 );
    Value = Msat_ClauseCreate( p, vLits, 1, &pC );
    assert( Value );
    Value = Msat_SolverEnqueue( p, Msat_IntVecReadEntry(vLits,0), pC );
    assert( Value );
    if ( pC )
        Msat_ClauseVecPush( p->vLearned, pC );
    return pC;
}